

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitCommon.c
# Opt level: O2

void sysbvm_jit_dwarfLineInfoEmissionState_emitSourcePosition
               (sysbvm_bytecodeJit_t *jit,sysbvm_jit_dwarfLineInfoEmissionState_t *state,
               sysbvm_tuple_t sourcePosition,size_t pc,uint32_t line,uint32_t column)

{
  uint32_t file;
  
  if ((sourcePosition & 0xf) == 0 && sourcePosition != 0) {
    if (*(sysbvm_tuple_t *)(sourcePosition + 0x10) != state->currentFile) {
      file = sysbvm_jit_dwarfLineInfoEmissionState_indexOfFile
                       (state,*(sysbvm_tuple_t *)(sourcePosition + 0x10));
      sysbvm_dwarf_debugInfo_line_setFile(&jit->dwarfDebugInfoBuilder,file);
      state->currentFile = *(sysbvm_tuple_t *)(sourcePosition + 0x10);
    }
    sysbvm_dwarf_debugInfo_line_setColumn(&jit->dwarfDebugInfoBuilder,column);
    sysbvm_dwarf_debugInfo_line_advanceLineAndPC
              (&jit->dwarfDebugInfoBuilder,line - state->previousLine,(int)pc - (int)state->pc);
    state->pc = pc;
    state->previousLine = line;
  }
  return;
}

Assistant:

void sysbvm_jit_dwarfLineInfoEmissionState_emitSourcePosition(sysbvm_bytecodeJit_t *jit, sysbvm_jit_dwarfLineInfoEmissionState_t *state, sysbvm_tuple_t sourcePosition, size_t pc, uint32_t line, uint32_t column)
{
    if(!sysbvm_tuple_isNonNullPointer(sourcePosition))
        return;

    sysbvm_sourcePosition_t *sourcePositionObject = (sysbvm_sourcePosition_t*)sourcePosition;

    // Set the source code.
    if(sourcePositionObject->sourceCode != state->currentFile)
    {
        sysbvm_dwarf_debugInfo_line_setFile(&jit->dwarfDebugInfoBuilder, sysbvm_jit_dwarfLineInfoEmissionState_indexOfFile(state, sourcePositionObject->sourceCode));
        state->currentFile = sourcePositionObject->sourceCode;
    }

    // Set the column.
    sysbvm_dwarf_debugInfo_line_setColumn(&jit->dwarfDebugInfoBuilder, column);

    int pcAdvance = (int)(pc - state->pc);
    int lineAdvance = line - state->previousLine;
    sysbvm_dwarf_debugInfo_line_advanceLineAndPC(&jit->dwarfDebugInfoBuilder, lineAdvance, pcAdvance);
    state->pc = pc;
    state->previousLine = line;
}